

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

_Bool cert_expr_valid(char *expression,char **error_msg,ptrlen *error_loc)

{
  size_t sVar1;
  ExprNode *en;
  ptrlen expr;
  
  sVar1 = strlen(expression);
  expr.len = sVar1;
  expr.ptr = expression;
  en = parse(expr,error_msg,error_loc);
  if (en != (ExprNode *)0x0) {
    exprnode_free(en);
  }
  return en != (ExprNode *)0x0;
}

Assistant:

bool cert_expr_valid(const char *expression,
                     char **error_msg, ptrlen *error_loc)
{
    ExprNode *en = parse(ptrlen_from_asciz(expression), error_msg, error_loc);
    if (en) {
        exprnode_free(en);
        return true;
    } else {
        return false;
    }
}